

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O3

string * __thiscall
soul::CompileMessage::getFullDescriptionWithoutFilename_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string filename;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  string local_48;
  
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  if ((this->location).location.data != (char *)0x0) {
    getPositionString_abi_cxx11_(&local_a8,this);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_78 = *plVar3;
      lStack_70 = plVar2[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar3;
      local_88 = (long *)*plVar2;
    }
    local_80 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  getSeverity_abi_cxx11_(&local_48,this);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_68);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8.field_2._8_8_ = plVar2[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_a8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)(this->description)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getFullDescriptionWithoutFilename() const
{
    std::string filename;

    if (hasPosition())
        filename = getPositionString() + ": ";

    return filename + getSeverity() + ": " + description;
}